

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

bool __thiscall helics::TimeCoordinator::updateTimeFactors(TimeCoordinator *this)

{
  TimeDependencies *dependencies;
  Time TVar1;
  Time TVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  TimeData *pTVar6;
  TimeData *pTVar7;
  long lVar8;
  bool bVar9;
  byte bVar10;
  TimeData TStack_78;
  
  bVar10 = 0;
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeTotal
            (&TStack_78,dependencies,
             (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),
             (GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,
             (this->super_BaseTimeCoordinator).sequenceCounter);
  lVar4 = 9;
  pTVar6 = &TStack_78;
  pTVar7 = &this->total;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pTVar7->next).internalTimeCode = *(baseType *)pTVar6;
    pTVar6 = (TimeData *)((long)pTVar6 + ((ulong)bVar10 * -2 + 1) * 8);
    pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  generateMinTimeUpstream
            (&TStack_78,dependencies,
             (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),
             (GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,
             (this->super_BaseTimeCoordinator).sequenceCounter);
  pTVar6 = &TStack_78;
  pTVar7 = &this->upstream;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pTVar7->next).internalTimeCode = *(baseType *)pTVar6;
    pTVar6 = (TimeData *)((long)pTVar6 + ((ulong)bVar10 * -2 + 1) * 8);
    pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
  }
  if ((this->globalTime == true) &&
     ((long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x58)) {
    pTVar6 = &this->total;
    pTVar7 = &this->upstream;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pTVar7->next).internalTimeCode = (pTVar6->next).internalTimeCode;
      pTVar6 = (TimeData *)((long)pTVar6 + (ulong)bVar10 * -0x10 + 8);
      pTVar7 = (TimeData *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
    }
    (this->upstream).minFed.gid = -2010000000;
  }
  lVar4 = (this->info).period.internalTimeCode;
  lVar3 = (this->info).timeDelta.internalTimeCode;
  if (lVar3 < lVar4) {
    lVar3 = lVar4;
  }
  (this->maxTime).internalTimeCode =
       0x7fffffffffffffff - (lVar3 + (this->info).outputDelay.internalTimeCode);
  lVar4 = (this->time_next).internalTimeCode;
  (this->time_minminDe).internalTimeCode = (this->total).minDe.internalTimeCode;
  updateNextPossibleEventTime(this);
  lVar3 = (this->time_next).internalTimeCode;
  TVar1.internalTimeCode = (this->total).minDe.internalTimeCode;
  lVar5 = (this->maxTime).internalTimeCode;
  if (TVar1.internalTimeCode < lVar5) {
    TVar1 = generateAllowedTime(this,TVar1);
    TVar1.internalTimeCode = TVar1.internalTimeCode + (this->info).outputDelay.internalTimeCode;
    (this->total).minDe.internalTimeCode = TVar1.internalTimeCode;
    lVar5 = (this->maxTime).internalTimeCode;
  }
  TVar2.internalTimeCode = (this->upstream).minDe.internalTimeCode;
  if ((TVar2.internalTimeCode < lVar5) && (TVar1.internalTimeCode < TVar2.internalTimeCode)) {
    TVar2 = generateAllowedTime(this,TVar2);
    TVar2.internalTimeCode = TVar2.internalTimeCode + (this->info).outputDelay.internalTimeCode;
    (this->upstream).minDe.internalTimeCode = TVar2.internalTimeCode;
  }
  if ((this->globalTime == false) &&
     ((((this->info).event_triggered != false ||
       ((this->time_requested).internalTimeCode == 0x7fffffffffffffff)) &&
      ((this->upstream).Te.internalTimeCode < (this->maxTime).internalTimeCode)))) {
    TVar1 = generateAllowedTime(this,TVar2);
    (this->upstream).Te.internalTimeCode = TVar1.internalTimeCode;
  }
  lVar5 = (this->total).minDe.internalTimeCode;
  bVar9 = lVar5 != (this->time_minDe).internalTimeCode;
  if (bVar9) {
    (this->time_minDe).internalTimeCode = lVar5;
  }
  lVar5 = (this->total).next.internalTimeCode;
  lVar8 = 0x7fffffffffffffff;
  if (lVar5 < (this->maxTime).internalTimeCode) {
    lVar8 = (this->info).inputDelay.internalTimeCode + lVar5;
  }
  (this->time_allow).internalTimeCode = lVar8;
  updateNextExecutionTime(this);
  return bVar9 || lVar4 != lVar3;
}

Assistant:

bool TimeCoordinator::updateTimeFactors()
{
    total = generateMinTimeTotal(dependencies,
                                 info.restrictive_time_policy || globalTime,
                                 GlobalFederateId{},
                                 NoIgnoredFederates,
                                 sequenceCounter);
    upstream = generateMinTimeUpstream(dependencies,
                                       info.restrictive_time_policy || globalTime,
                                       GlobalFederateId{},
                                       NoIgnoredFederates,
                                       sequenceCounter);
    if (globalTime && dependencies.size() == 1) {
        upstream = total;
        upstream.minFed = GlobalFederateId{};
    }

    maxTime = Time::maxVal() - info.outputDelay - (std::max)(info.period, info.timeDelta);
    bool update = false;
    time_minminDe = total.minDe;
    Time prev_next = time_next;
    updateNextPossibleEventTime();

    //    printf("%d UPDATE next=%f, minminDE=%f, Tdemin=%f\n", source_id,
    //    static_cast<double>(time_next),
    // static_cast<double>(minminDe), static_cast<double>(minDe));
    if (prev_next != time_next) {
        update = true;
    }
    if (total.minDe < maxTime) {
        total.minDe = generateAllowedTime(total.minDe) + info.outputDelay;
    }
    if (upstream.minDe < maxTime && upstream.minDe > total.minDe) {
        upstream.minDe = generateAllowedTime(upstream.minDe) + info.outputDelay;
    }
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        if (upstream.Te < maxTime) {
            upstream.Te = generateAllowedTime(upstream.minDe);
        }
    }
    if (total.minDe != time_minDe) {
        update = true;
        time_minDe = total.minDe;
    }
    time_allow = (total.next < maxTime) ? info.inputDelay + total.next : Time::maxVal();

    updateNextExecutionTime();
    return update;
}